

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

bool __thiscall
glcts::ViewportArray::ScissorClear::checkResults
          (ScissorClear *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  byte bVar1;
  bool bVar2;
  reference pvVar3;
  GLint local_64;
  bool result;
  GLint expected_value;
  GLint *layer_data;
  GLuint x;
  GLuint y;
  GLuint layer;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> texture_data;
  bool check_result;
  GLuint param_4_local;
  texture *param_3_local;
  texture *texture_0_local;
  ScissorClear *this_local;
  
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 1;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = param_3;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_40,0x40000);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  Utils::texture::get(texture_0,0x8d94,0x1404,pvVar3);
  x = 0;
  do {
    if (0xf < x) {
LAB_016fe81b:
      bVar1 = texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._3_1_;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40)
      ;
      return (bool)(bVar1 & 1);
    }
    for (layer_data._4_4_ = 0; layer_data._4_4_ < 4; layer_data._4_4_ = layer_data._4_4_ + 1) {
      for (layer_data._0_4_ = 0; (uint)layer_data < 4; layer_data._0_4_ = (uint)layer_data + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_40,(ulong)(x << 0xe));
        local_64 = -1;
        if (((uint)layer_data == 0) && (layer_data._4_4_ == 0)) {
          local_64 = 0;
        }
        bVar2 = DrawTestBase::checkRegionR32I
                          ((DrawTestBase *)this,(uint)layer_data,layer_data._4_4_,local_64,pvVar3);
        if (!bVar2) {
          texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._3_1_ = 0;
          goto LAB_016fe81b;
        }
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

bool ScissorClear::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */, GLuint /*draw_call_index */)
{
	static const GLuint layer_size = m_width * m_height;

	bool check_result = true;

	std::vector<GLint> texture_data;
	texture_data.resize(layer_size * m_depth);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	/* 16 layers, only region corresponding with scissor box 0 should be modified */
	for (GLuint layer = 0; layer < m_depth; ++layer)
	{
		for (GLuint y = 0; y < 4; ++y)
		{
			for (GLuint x = 0; x < 4; ++x)
			{
				GLint* layer_data = &texture_data[layer * layer_size];

				GLint expected_value = -1;
				if ((0 == x) && (0 == y))
				{
					expected_value = 0;
				}

				bool result = checkRegionR32I(x, y, expected_value, layer_data);

				if (false == result)
				{
					check_result = false;
					goto end;
				}
			}
		}
	}

end:
	return check_result;
}